

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# roaring.c
# Opt level: O1

void roaring_bitmap_flip_inplace_closed
               (roaring_bitmap_t *x1,uint32_t range_start,uint32_t range_end)

{
  ushort uVar1;
  uint16_t *puVar2;
  rle16_t *prVar3;
  run_container_t *c;
  _Bool _Var4;
  uint8_t uVar5;
  int iVar6;
  array_container_t *src;
  run_container_t *prVar7;
  uint uVar8;
  uint16_t lb_start;
  uint uVar9;
  uint uVar10;
  uint uVar11;
  uint8_t type;
  uint uVar12;
  ushort key;
  uint uVar13;
  bool bVar14;
  uint8_t local_43;
  uint16_t local_42;
  run_container_t *local_40;
  uint local_34;
  uint16_t hb;
  
  if (range_start <= range_end) {
    uVar13 = range_start >> 0x10;
    uVar12 = range_end >> 0x10;
    lb_start = (uint16_t)range_start;
    local_42 = (uint16_t)range_end;
    hb = (uint16_t)(range_start >> 0x10);
    if (uVar13 == uVar12) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,local_42);
      return;
    }
    if (lb_start != 0) {
      inplace_flip_container(&x1->high_low_container,hb,lb_start,0xffff);
      uVar13 = uVar13 + 1 & 0xffff;
    }
    local_34 = range_end & 0xffff;
    uVar8 = uVar12 - 1 & 0xffff;
    if (local_34 == 0xffff) {
      uVar8 = uVar12;
    }
    if (uVar13 <= uVar8) {
      do {
        iVar6 = (x1->high_low_container).size;
        key = (ushort)uVar13;
        if (((long)iVar6 == 0) ||
           (puVar2 = (x1->high_low_container).keys, puVar2[(long)iVar6 + -1] == key)) {
          uVar12 = iVar6 - 1;
        }
        else {
          uVar10 = iVar6 - 1;
          uVar9 = 0;
          uVar11 = uVar10;
          do {
            if ((int)uVar10 < (int)uVar9) {
              uVar12 = ~uVar9;
              break;
            }
            uVar12 = uVar9 + uVar10 >> 1;
            uVar1 = *(ushort *)((long)puVar2 + (ulong)(uVar9 + uVar10 & 0xfffffffe));
            if (uVar1 < key) {
              uVar9 = uVar12 + 1;
              bVar14 = true;
              uVar12 = uVar11;
            }
            else if (key < uVar1) {
              uVar10 = uVar12 - 1;
              bVar14 = true;
              uVar12 = uVar11;
            }
            else {
              bVar14 = false;
            }
            uVar11 = uVar12;
          } while (bVar14);
        }
        if ((int)uVar12 < 0) {
          prVar7 = run_container_create_given_capacity(1);
          if (prVar7 != (run_container_t *)0x0) {
            prVar3 = prVar7->runs;
            iVar6 = prVar7->n_runs;
            prVar3[iVar6].value = 0;
            prVar3[iVar6].length = 0xffff;
            prVar7->n_runs = prVar7->n_runs + 1;
          }
          ra_insert_new_key_value_at(&x1->high_low_container,~uVar12,key,prVar7,'\x03');
        }
        else {
          local_43 = (x1->high_low_container).typecodes[uVar12 & 0xffff];
          src = (array_container_t *)(x1->high_low_container).containers[uVar12 & 0xffff];
          if (local_43 == '\x04') {
            src = (array_container_t *)
                  shared_container_extract_copy((shared_container_t *)src,&local_43);
          }
          local_40 = (run_container_t *)0x0;
          if (local_43 == '\x03') {
            iVar6 = run_container_negation_inplace((run_container_t *)src,&local_40);
            type = (uint8_t)iVar6;
          }
          else if (local_43 == '\x02') {
            local_40 = (run_container_t *)bitset_container_create();
            array_container_negation(src,(bitset_container_t *)local_40);
            array_container_free(src);
            type = '\x01';
          }
          else {
            _Var4 = bitset_container_negation_inplace((bitset_container_t *)src,&local_40);
            type = '\x02' - _Var4;
          }
          c = local_40;
          prVar7 = local_40;
          uVar5 = type;
          if (type == '\x04') {
            uVar5 = *(uint8_t *)&local_40->runs;
            prVar7 = *(run_container_t **)local_40;
          }
          if (uVar5 == '\x03') {
            iVar6 = run_container_cardinality(prVar7);
          }
          else {
            iVar6 = prVar7->n_runs;
          }
          if (iVar6 == 0) {
            container_free(c,type);
            ra_remove_at_index(&x1->high_low_container,uVar12);
          }
          else {
            (x1->high_low_container).containers[uVar12] = c;
            (x1->high_low_container).typecodes[uVar12] = type;
          }
        }
        bVar14 = uVar13 != uVar8;
        uVar13 = uVar13 + 1;
      } while (bVar14);
    }
    if (local_34 != 0xffff) {
      inplace_flip_container(&x1->high_low_container,(short)uVar8 + 1,0,local_42);
    }
  }
  return;
}

Assistant:

void roaring_bitmap_flip_inplace_closed(roaring_bitmap_t *x1,
                                        uint32_t range_start,
                                        uint32_t range_end) {
    if (range_start > range_end) {
        return;  // empty range
    }

    uint16_t hb_start = (uint16_t)(range_start >> 16);
    const uint16_t lb_start = (uint16_t)range_start;
    uint16_t hb_end = (uint16_t)(range_end >> 16);
    const uint16_t lb_end = (uint16_t)range_end;

    if (hb_start == hb_end) {
        inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                               lb_end);
    } else {
        // start and end containers are distinct
        if (lb_start > 0) {
            // handle first (partial) container
            inplace_flip_container(&x1->high_low_container, hb_start, lb_start,
                                   0xFFFF);
            ++hb_start;  // for the full containers.  Can't wrap.
        }

        if (lb_end != 0xFFFF) --hb_end;

        for (uint32_t hb = hb_start; hb <= hb_end; ++hb) {
            inplace_fully_flip_container(&x1->high_low_container, (uint16_t)hb);
        }
        // handle a partial final container
        if (lb_end != 0xFFFF) {
            inplace_flip_container(&x1->high_low_container, hb_end + 1, 0,
                                   lb_end);
            ++hb_end;
        }
    }
}